

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Function.cpp
# Opt level: O1

void __thiscall
Refal2::CFunctionBuilder::AddVariable
          (CFunctionBuilder *this,TVariableTypeTag type,TVariableName name,CQualifier *qualifier)

{
  bool bVar1;
  int variable;
  CUnit local_28;
  
  if ((this->super_CVariablesBuilder).field_0x1aac == '\x01') {
    variable = CVariablesBuilder::AddRight(&this->super_CVariablesBuilder,name,type);
  }
  else {
    variable = CVariablesBuilder::AddLeft(&this->super_CVariablesBuilder,name,type);
  }
  bVar1 = CErrorsHelper::HasErrors((CErrorsHelper *)this);
  if (!bVar1) {
    if (variable == -1) {
      __assert_fail("index != InvalidVariableIndex",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/cmc-msu-ai[P]refal/src/Function.cpp"
                    ,0x10a,
                    "void Refal2::CFunctionBuilder::AddVariable(TVariableTypeTag, TVariableName, CQualifier *)"
                   );
    }
    if (qualifier != (CQualifier *)0x0) {
      CVariablesBuilder::AddQualifier(&this->super_CVariablesBuilder,variable,qualifier);
    }
    local_28.type = UT_Variable;
    local_28.field_1.variable = variable;
    CNodeList<Refal2::CUnit>::Append(&(this->acc).super_CNodeList<Refal2::CUnit>,&local_28);
  }
  return;
}

Assistant:

void CFunctionBuilder::AddVariable( TVariableTypeTag type, TVariableName name,
	CQualifier* qualifier )
{
	const TVariableIndex index = isProcessRightPart ?
		CVariablesBuilder::AddRight( name, type ) :
		CVariablesBuilder::AddLeft( name, type );
	if( !HasErrors() ) {
		assert( index != InvalidVariableIndex );
		if( qualifier != nullptr ) {
			CVariablesBuilder::AddQualifier( index, *qualifier );
		}
		acc.AppendVariable( index );
	}
}